

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O0

void __thiscall BronKerbosch::degeneracy_order(BronKerbosch *this)

{
  bool bVar1;
  undefined8 *puVar2;
  void *pvVar3;
  pointer ppVar4;
  reference pppVar5;
  reference pppVar6;
  mapped_type *this_00;
  size_type sVar7;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>,_bool>
  pVar8;
  size_type s;
  adjacency_list_t *companion;
  unsigned_long *index;
  iterator __end2;
  iterator __begin2;
  list<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  adjacency_list_t *list_vertex;
  iterator it_1;
  size_type ind;
  iterator it;
  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
  *in_stack_fffffffffffffe18;
  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
  *in_stack_fffffffffffffe20;
  iterator in_stack_fffffffffffffe28;
  value_type *in_stack_fffffffffffffe30;
  vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  *this_01;
  value_type in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
  in_stack_fffffffffffffe48;
  list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  *in_stack_fffffffffffffe50;
  list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  *this_02;
  value_type local_e0;
  reference local_d8;
  _Self local_d0;
  _Self local_c8;
  list<unsigned_long,_std::allocator<unsigned_long>_> *local_c0;
  value_type local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  undefined1 local_93;
  _List_const_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
  local_70;
  _List_node_base *local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  size_type local_20;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
       ::begin((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                *)in_stack_fffffffffffffe18);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
         ::end((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                *)in_stack_fffffffffffffe18);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    std::
    _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
    ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                 *)0x256294);
    local_20 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe20);
    sVar7 = std::
            map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
            ::count((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                     *)in_stack_fffffffffffffe30,
                    (key_type_conflict1 *)in_stack_fffffffffffffe28._M_node);
    if (sVar7 == 0) {
      std::
      _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                   *)0x2562ef);
      std::
      allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::allocator((allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                   *)0x25630c);
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::list(in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48._M_node,
             (value_type *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (allocator_type *)in_stack_fffffffffffffe38);
      pVar8 = std::
              map<unsigned_long,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
              ::
              emplace<unsigned_long&,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>
                        ((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                          *)in_stack_fffffffffffffe30,
                         (unsigned_long *)in_stack_fffffffffffffe28._M_node,
                         (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                          *)in_stack_fffffffffffffe20);
      local_60 = (_Base_ptr)pVar8.first._M_node;
      local_58 = pVar8.second;
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::~list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
               *)0x256389);
      std::
      allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::~allocator((allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                    *)0x256396);
    }
    else {
      std::
      map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
      ::at((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
           &in_stack_fffffffffffffe38->first);
      std::
      _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                   *)0x256412);
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::push_back((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28._M_node);
    }
    std::
    _List_const_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
    ::_List_const_iterator(&local_70,local_10);
    local_68 = (_List_node_base *)
               std::__cxx11::
               list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
               ::erase((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                        *)in_stack_fffffffffffffe20,
                       (const_iterator)in_stack_fffffffffffffe28._M_node);
    local_10[0]._M_node = local_68;
  }
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x2564a1);
  *(undefined8 **)(in_RDI + 0x58) = puVar2;
  pvVar3 = operator_new(0x18);
  local_93 = 1;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2564ef);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (size_type)in_stack_fffffffffffffe38,(unsigned_long)in_stack_fffffffffffffe30,
             (allocator<unsigned_long> *)in_stack_fffffffffffffe28._M_node);
  std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             0x25651e);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
           (size_type)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
           (allocator_type *)in_stack_fffffffffffffe28._M_node);
  local_93 = 0;
  *(void **)(in_RDI + 0x60) = pvVar3;
  std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             0x256562);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25656f);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x25657c);
  while (bVar1 = std::
                 map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                 ::empty((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                          *)0x25658d), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_a0 = (_Base_ptr)
               std::
               map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
               ::begin(in_stack_fffffffffffffe18);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
                           *)0x2565be);
    bVar1 = std::__cxx11::
            list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
            ::empty(&ppVar4->second);
    if (bVar1) {
      local_a8 = local_a0;
      local_b0 = (_Base_ptr)
                 std::
                 map<unsigned_long,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                 ::erase_abi_cxx11_(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
                    *)0x256682);
      pppVar5 = std::__cxx11::
                list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                ::front((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                         *)in_stack_fffffffffffffe20);
      local_b8 = *pppVar5;
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
                    *)0x2566a6);
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::pop_front((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)in_stack_fffffffffffffe20);
      local_c0 = &local_b8->second;
      local_c8._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe18);
      local_d0._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe18);
      while (bVar1 = std::operator!=(&local_c8,&local_d0), bVar1) {
        local_d8 = std::_List_iterator<unsigned_long>::operator*
                             ((_List_iterator<unsigned_long> *)0x25671b);
        pppVar6 = std::
                  vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                  ::operator[](*(vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                                 **)(in_RDI + 0x78),*local_d8);
        local_e0 = *pppVar6;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe20)
        ;
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[](*(vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       **)(in_RDI + 0x60),local_b8->first);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28._M_node,
                   SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[](*(vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       **)(in_RDI + 0x60),local_e0->first);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28._M_node,
                   SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::remove
                  (&local_e0->second,(char *)local_b8);
        this_00 = std::
                  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                  ::at((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                       &in_stack_fffffffffffffe38->first);
        std::__cxx11::
        list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        ::remove(this_00,(char *)&local_e0);
        sVar7 = std::
                map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                ::count((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                         *)in_stack_fffffffffffffe30,
                        (key_type_conflict1 *)in_stack_fffffffffffffe28._M_node);
        if (sVar7 == 0) {
          this_02 = *(list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                      **)(in_RDI + 0x68);
          std::
          allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
          ::allocator((allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                       *)0x256880);
          std::__cxx11::
          list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
          ::list(this_02,(size_type)in_stack_fffffffffffffe48._M_node,
                 (value_type *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (allocator_type *)in_stack_fffffffffffffe38);
          pVar8 = std::
                  map<unsigned_long,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                  ::
                  emplace<unsigned_long,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>
                            ((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                              *)in_stack_fffffffffffffe30,
                             (unsigned_long *)in_stack_fffffffffffffe28._M_node,
                             (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                              *)in_stack_fffffffffffffe20);
          in_stack_fffffffffffffe48 = pVar8.first._M_node;
          in_stack_fffffffffffffe47 = pVar8.second;
          std::__cxx11::
          list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
          ::~list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)0x2568eb);
          std::
          allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
          ::~allocator((allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                        *)0x2568f8);
        }
        else {
          std::
          map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
          ::at((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               &in_stack_fffffffffffffe38->first);
          std::__cxx11::
          list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
          ::push_front((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                        *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28._M_node)
          ;
        }
        std::_List_iterator<unsigned_long>::operator++(&local_c8);
      }
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe30,
                 (value_type_conflict3 *)in_stack_fffffffffffffe28._M_node);
      in_stack_fffffffffffffe38 = local_b8;
      if (local_b8 != (value_type)0x0) {
        std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair((pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)0x2569cd);
        operator_delete(in_stack_fffffffffffffe38);
      }
    }
  }
  this_01 = *(vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
              **)(in_RDI + 0x68);
  if (this_01 !=
      (vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
       *)0x0) {
    std::
    map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
    ::~map((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
            *)0x2569fd);
    operator_delete(this_01);
  }
  pvVar3 = *(void **)(in_RDI + 0x70);
  if (pvVar3 != (void *)0x0) {
    std::__cxx11::
    list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
    ::~list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
             *)0x256a28);
    operator_delete(pvVar3);
  }
  pvVar3 = *(void **)(in_RDI + 0x78);
  if (pvVar3 != (void *)0x0) {
    std::
    vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
    ::~vector(this_01);
    operator_delete(pvVar3);
  }
  return;
}

Assistant:

void BronKerbosch::degeneracy_order() {

    // Move all still active vertices into the degree map
    for (auto it = actives_->begin(); it != actives_->end();) {
        list<adjacency_list_t*>::size_type ind = (*it)->second.size();

        if(degree_map_->count(ind) == 0) {           
            degree_map_->emplace(ind, list<adjacency_list_t*>(1, *it) );
	//	degree_map_->insert(std::pair<std::list<adjacency_list_t*>::size_type, std::list<adjacency_list_t*>>(ind,list<adjacency_list_t*>(1, *it)));
	

        } else {
            degree_map_->at(ind).push_back(*it);
        }
        
        it = actives_->erase(it);
    }

    order_ = new list<size_t>();
    vertices_ = new vector<alignment_set_t>(alignment_count, alignment_set_t(alignment_count));

    while (not degree_map_->empty()) {
        auto it = degree_map_->begin();

        if (it->second.empty()) {
            degree_map_->erase(it);
            continue;
        }
        
        adjacency_list_t* list_vertex = it->second.front();
        it->second.pop_front();

        // Update degree map
        for (auto&& index : list_vertex->second) {
            adjacency_list_t* companion = (*vertices_as_lists_)[index];
            list<adjacency_list_t*>::size_type s = companion->second.size();

            (*vertices_)[list_vertex->first].set(companion->first);
            (*vertices_)[companion->first].set(list_vertex->first);

            companion->second.remove(list_vertex->first);

            degree_map_->at(s).remove(companion);

            if (degree_map_->count(s-1) == 0) {
                degree_map_->emplace(s-1, list<adjacency_list_t*>(1, companion) );                
		//degree_map_->insert(std::pair<std::list<adjacency_list_t*>::size_type, std::list<adjacency_list_t*>>(s-1, list<adjacency_list_t*>(1, companion)));
            } else {
                degree_map_->at(s-1).push_front(companion);
            }
        }
        order_->push_back(list_vertex->first);

        delete list_vertex;
    }

    delete degree_map_;
    delete actives_;
    delete vertices_as_lists_;
}